

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateRegisterInterfaces(HelicsFederate fed,char *file,HelicsError *err)

{
  Federate *pFVar1;
  allocator<char> local_39;
  string local_38 [32];
  
  pFVar1 = getFed(fed,err);
  if (pFVar1 != (Federate *)0x0) {
    if (file == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "Invalid File specification";
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>(local_38,file,&local_39);
      (*pFVar1->_vptr_Federate[0xf])(pFVar1,local_38);
      std::__cxx11::string::~string(local_38);
    }
  }
  return;
}

Assistant:

void helicsFederateRegisterInterfaces(HelicsFederate fed, const char* file, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    if (file == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidFile);
        return;
    }
    try {
        fedObj->registerInterfaces(file);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}